

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_exp_mod_optionally_safe
              (mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *E,int E_public,mbedtls_mpi *N,
              mbedtls_mpi *prec_RR)

{
  mbedtls_mpi_uint *X_00;
  int iVar1;
  size_t sVar2;
  mbedtls_mpi_uint *T;
  mbedtls_mpi_uint mm;
  mbedtls_ct_condition_t mVar3;
  mbedtls_mpi RR;
  mbedtls_mpi_uint p [1];
  
  p[0] = 0;
  RR.s = 1;
  RR.n = 1;
  RR.p = p;
  iVar1 = mbedtls_mpi_cmp_mpi(N,&RR);
  if (iVar1 < 1) {
    return -4;
  }
  if ((*N->p & 1) == 0) {
    return -4;
  }
  p[0] = 0;
  RR.s = 1;
  RR.n = 1;
  RR.p = p;
  iVar1 = mbedtls_mpi_cmp_mpi(E,&RR);
  if (iVar1 < 0) {
    return -4;
  }
  sVar2 = mbedtls_mpi_core_bitlen(E->p,(ulong)E->n);
  if (0x2000 < sVar2) {
    return -4;
  }
  sVar2 = mbedtls_mpi_core_bitlen(N->p,(ulong)N->n);
  if (0x2000 < sVar2) {
    return -4;
  }
  if ((ulong)E->n == 0) {
    iVar1 = mbedtls_mpi_lset(X,1);
    return iVar1;
  }
  sVar2 = mbedtls_mpi_core_exp_mod_working_limbs((ulong)N->n,(ulong)E->n);
  T = (mbedtls_mpi_uint *)calloc(sVar2,8);
  if (T == (mbedtls_mpi_uint *)0x0) {
    return -0x10;
  }
  RR.s = 1;
  RR.n = 0;
  RR.p = (mbedtls_mpi_uint *)0x0;
  if ((prec_RR == (mbedtls_mpi *)0x0) || (prec_RR->p == (mbedtls_mpi_uint *)0x0)) {
    iVar1 = mbedtls_mpi_core_get_mont_r2_unsafe(&RR,N);
    if (iVar1 != 0) goto LAB_01d30c73;
    if (prec_RR != (mbedtls_mpi *)0x0) {
      prec_RR->p = RR.p;
      prec_RR->s = RR.s;
      prec_RR->n = RR.n;
      *(undefined4 *)&prec_RR->field_0xc = RR._12_4_;
    }
  }
  else {
    iVar1 = mbedtls_mpi_grow(prec_RR,(ulong)N->n);
    if (iVar1 != 0) goto LAB_01d30c73;
    RR.p = prec_RR->p;
    RR.s = prec_RR->s;
    RR.n = prec_RR->n;
    RR._12_4_ = *(undefined4 *)&prec_RR->field_0xc;
  }
  iVar1 = mbedtls_mpi_copy(X,A);
  if (iVar1 == 0) {
    X->s = 1;
    iVar1 = mbedtls_mpi_cmp_mpi(X,N);
    if (((iVar1 < 0) || (iVar1 = mbedtls_mpi_mod_mpi(X,X,N), iVar1 == 0)) &&
       (iVar1 = mbedtls_mpi_grow(X,(ulong)N->n), iVar1 == 0)) {
      mm = mbedtls_mpi_core_montmul_init(N->p);
      mbedtls_mpi_core_to_mont_rep(X->p,X->p,N->p,(ulong)N->n,mm,RR.p,T);
      X_00 = X->p;
      if (E_public == 0x2a2a2a2a) {
        mbedtls_mpi_core_exp_mod_unsafe(X_00,X_00,N->p,(ulong)N->n,E->p,(ulong)E->n,RR.p,T);
      }
      else {
        mbedtls_mpi_core_exp_mod(X_00,X_00,N->p,(ulong)N->n,E->p,(ulong)E->n,RR.p,T);
      }
      mbedtls_mpi_core_from_mont_rep(X->p,X->p,N->p,(ulong)N->n,mm,T);
      iVar1 = 0;
      if ((A->s == -1) && ((*E->p & 1) != 0)) {
        mVar3 = mbedtls_mpi_core_check_zero_ct(X->p,(ulong)X->n);
        X->s = (~((ushort)mbedtls_ct_zero ^ (ushort)mVar3) & 2) - 1;
        iVar1 = add_sub_mpi(X,N,X,1);
      }
    }
  }
LAB_01d30c73:
  mbedtls_zeroize_and_free(T,sVar2 << 3);
  if (((prec_RR == (mbedtls_mpi *)0x0) || (prec_RR->p == (mbedtls_mpi_uint *)0x0)) &&
     (RR.p != (mbedtls_mpi_uint *)0x0)) {
    mbedtls_zeroize_and_free(RR.p,((ulong)RR._8_8_ >> 0x10 & 0xffff) << 3);
  }
  return iVar1;
}

Assistant:

static int mbedtls_mpi_exp_mod_optionally_safe(mbedtls_mpi *X, const mbedtls_mpi *A,
                                               const mbedtls_mpi *E, int E_public,
                                               const mbedtls_mpi *N, mbedtls_mpi *prec_RR)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (mbedtls_mpi_cmp_int(N, 0) <= 0 || (N->p[0] & 1) == 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_cmp_int(E, 0) < 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_bitlen(E) > MBEDTLS_MPI_MAX_BITS ||
        mbedtls_mpi_bitlen(N) > MBEDTLS_MPI_MAX_BITS) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /*
     * Ensure that the exponent that we are passing to the core is not NULL.
     */
    if (E->n == 0) {
        ret = mbedtls_mpi_lset(X, 1);
        return ret;
    }

    /*
     * Allocate working memory for mbedtls_mpi_core_exp_mod()
     */
    size_t T_limbs = mbedtls_mpi_core_exp_mod_working_limbs(N->n, E->n);
    mbedtls_mpi_uint *T = (mbedtls_mpi_uint *) mbedtls_calloc(T_limbs, sizeof(mbedtls_mpi_uint));
    if (T == NULL) {
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    mbedtls_mpi RR;
    mbedtls_mpi_init(&RR);

    /*
     * If 1st call, pre-compute R^2 mod N
     */
    if (prec_RR == NULL || prec_RR->p == NULL) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_core_get_mont_r2_unsafe(&RR, N));

        if (prec_RR != NULL) {
            *prec_RR = RR;
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(prec_RR, N->n));
        RR = *prec_RR;
    }

    /*
     * To preserve constness we need to make a copy of A. Using X for this to
     * save memory.
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, A));

    /*
     * Compensate for negative A (and correct at the end).
     */
    X->s = 1;

    /*
     * Make sure that X is in a form that is safe for consumption by
     * the core functions.
     *
     * - The core functions will not touch the limbs of X above N->n. The
     *   result will be correct if those limbs are 0, which the mod call
     *   ensures.
     * - Also, X must have at least as many limbs as N for the calls to the
     *   core functions.
     */
    if (mbedtls_mpi_cmp_mpi(X, N) >= 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(X, X, N));
    }
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, N->n));

    /*
     * Convert to and from Montgomery around mbedtls_mpi_core_exp_mod().
     */
    {
        mbedtls_mpi_uint mm = mbedtls_mpi_core_montmul_init(N->p);
        mbedtls_mpi_core_to_mont_rep(X->p, X->p, N->p, N->n, mm, RR.p, T);
        if (E_public == MBEDTLS_MPI_IS_PUBLIC) {
            mbedtls_mpi_core_exp_mod_unsafe(X->p, X->p, N->p, N->n, E->p, E->n, RR.p, T);
        } else {
            mbedtls_mpi_core_exp_mod(X->p, X->p, N->p, N->n, E->p, E->n, RR.p, T);
        }
        mbedtls_mpi_core_from_mont_rep(X->p, X->p, N->p, N->n, mm, T);
    }

    /*
     * Correct for negative A.
     */
    if (A->s == -1 && (E->p[0] & 1) != 0) {
        mbedtls_ct_condition_t is_x_non_zero = mbedtls_mpi_core_check_zero_ct(X->p, X->n);
        X->s = mbedtls_ct_mpi_sign_if(is_x_non_zero, -1, 1);

        MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(X, N, X));
    }

cleanup:

    mbedtls_mpi_zeroize_and_free(T, T_limbs);

    if (prec_RR == NULL || prec_RR->p == NULL) {
        mbedtls_mpi_free(&RR);
    }

    return ret;
}